

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

bool __thiscall QSslSocket::waitForDisconnected(QSslSocket *this,int msecs)

{
  QAbstractSocketPrivate *this_00;
  _func_int **pp_Var1;
  Data *pDVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  SocketState SVar6;
  int iVar7;
  undefined4 uVar8;
  SocketError errorCode;
  QLoggingCategory *this_01;
  long in_FS_OFFSET;
  QString local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  SVar6 = QAbstractSocket::state((QAbstractSocket *)this);
  if (SVar6 == UnconnectedState) {
    this_01 = QtPrivateLogging::lcSsl();
    if (((this_01->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      waitForDisconnected((QSslSocket *)this_01);
    }
LAB_002522c1:
    cVar4 = '\0';
  }
  else {
    pp_Var1 = this_00[1].super_QAbstractSocketEngineReceiver._vptr_QAbstractSocketEngineReceiver;
    if (pp_Var1 == (_func_int **)0x0) goto LAB_002522c1;
    if ((*(int *)(this_00 + 1) == 0) && (this_00[1].field_0x4 == '\0')) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        uVar5 = (**(code **)(*pp_Var1 + 0x138))(pp_Var1,msecs);
        return (bool)uVar5;
      }
      goto LAB_00252317;
    }
    local_38 = 0x8000000000000000;
    uStack_30 = 0x8000000000000000;
    QElapsedTimer::start();
    if (this_00[1].field_0x5 == '\0') {
      bVar3 = waitForEncrypted(this,msecs);
      if (!bVar3) goto LAB_002522c1;
    }
    if (((*(long *)&this_00->field_0x98 != 0) &&
        (*(long *)(*(long *)&this_00->field_0x98 + 0x18) != 0)) &&
       (pDVar2 = this_00[1].hostName.d.d, pDVar2 != (Data *)0x0)) {
      (**(code **)(*(long *)&pDVar2->super_QArrayData + 200))();
    }
    SVar6 = QAbstractSocket::state((QAbstractSocket *)this);
    if (SVar6 == UnconnectedState) {
      cVar4 = '\x01';
    }
    else {
      pp_Var1 = this_00[1].super_QAbstractSocketEngineReceiver._vptr_QAbstractSocketEngineReceiver;
      iVar7 = QElapsedTimer::elapsed();
      uVar8 = qt_subtract_from_timeout(msecs,iVar7);
      cVar4 = (**(code **)(*pp_Var1 + 0x138))(pp_Var1,uVar8);
      if (cVar4 == '\0') {
        SVar6 = QAbstractSocket::state
                          ((QAbstractSocket *)
                           this_00[1].super_QAbstractSocketEngineReceiver.
                           _vptr_QAbstractSocketEngineReceiver);
        QAbstractSocket::setSocketState((QAbstractSocket *)this,SVar6);
        errorCode = QAbstractSocket::error
                              ((QAbstractSocket *)
                               this_00[1].super_QAbstractSocketEngineReceiver.
                               _vptr_QAbstractSocketEngineReceiver);
        QIODevice::errorString();
        QAbstractSocketPrivate::setError(this_00,errorCode,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)cVar4;
  }
LAB_00252317:
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::waitForDisconnected(int msecs)
{
    Q_D(QSslSocket);

    // require calling connectToHost() before waitForDisconnected()
    if (state() == UnconnectedState) {
        qCWarning(lcSsl, "QSslSocket::waitForDisconnected() is not allowed in UnconnectedState");
        return false;
    }

    if (!d->plainSocket)
        return false;
    // Forward to the plain socket unless the connection is secure.
    if (d->mode == UnencryptedMode && !d->autoStartHandshake)
        return d->plainSocket->waitForDisconnected(msecs);

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (!d->connectionEncrypted) {
        // Wait until we've entered encrypted mode, or until a failure occurs.
        if (!waitForEncrypted(msecs))
            return false;
    }
    // We are delaying the disconnect, if the write buffer is not empty.
    // So, start the transmission.
    if (!d->writeBuffer.isEmpty())
        d->transmit();

    // At this point, the socket might be disconnected, if disconnectFromHost()
    // was called just after the connectToHostEncrypted() call. Also, we can
    // lose the connection as a result of the transmit() call.
    if (state() == UnconnectedState)
        return true;

    bool retVal = d->plainSocket->waitForDisconnected(qt_subtract_from_timeout(msecs, stopWatch.elapsed()));
    if (!retVal) {
        setSocketState(d->plainSocket->state());
        d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    }
    return retVal;
}